

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

bool rcg::setString(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                   bool exception)

{
  int iVar1;
  element_type *peVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  long *plVar7;
  undefined8 uVar8;
  invalid_argument *piVar9;
  long *plVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  longlong lVar14;
  undefined7 in_register_00000009;
  size_type *psVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  string elem;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  stringstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined4 local_22c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  long *local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8;
  long lStack_1e0;
  string local_1d8 [4];
  ios_base local_158 [264];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_22c = (undefined4)CONCAT71(in_register_00000009,exception);
  peVar2 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_1d8,name);
  iVar5 = (*(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar2,local_1d8);
  plVar10 = (long *)CONCAT44(extraout_var,iVar5);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_1d8);
  if (plVar10 == (long *)0x0) {
    if ((char)local_22c == '\0') {
      return false;
    }
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Feature not found: ","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar10;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar15) {
      local_1d8[0].field_2._0_8_ = *psVar15;
      local_1d8[0].field_2._8_8_ = plVar10[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar15;
    }
    local_1d8[0]._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar9,(string *)local_1d8);
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar5 = (*(code *)**(undefined8 **)((long)plVar10 + *(long *)(*plVar10 + -0x28)))
                    ((long)plVar10 + *(long *)(*plVar10 + -0x28));
  if ((iVar5 != 4) && (iVar5 != 2)) {
    if ((char)local_22c == '\0') {
      return false;
    }
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"Feature not writable: ","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar10;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar15) {
      local_1d8[0].field_2._0_8_ = *psVar15;
      local_1d8[0].field_2._8_8_ = plVar10[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar15;
    }
    local_1d8[0]._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar9,(string *)local_1d8);
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar6 = (**(code **)(*plVar10 + 0xf0))(plVar10);
  switch(uVar6) {
  case 2:
    plVar10 = (long *)__dynamic_cast(plVar10,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    iVar5 = (**(code **)(*plVar10 + 0x88))(plVar10);
    if (iVar5 != 4) {
      if (iVar5 == 5) {
        std::__cxx11::string::string((string *)&local_250,value,(allocator *)&local_228);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1d8,(string *)&local_250,_S_out|_S_in);
        local_200 = plVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        local_250._M_string_length = 0;
        local_250.field_2._M_allocated_capacity =
             local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
        iVar5 = 4;
        uVar16 = 0;
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        do {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1d8,(string *)&local_250,'.');
          _Var3._M_p = local_250._M_dataplus._M_p;
          piVar12 = __errno_location();
          iVar1 = *piVar12;
          *piVar12 = 0;
          uVar13 = strtol(_Var3._M_p,(char **)&local_228,10);
          if (local_228._M_dataplus._M_p == _Var3._M_p) goto LAB_0011c77c;
          if ((uVar13 - 0x80000000 < 0xffffffff00000000) || (*piVar12 == 0x22)) goto LAB_0011c788;
          if (*piVar12 == 0) {
            *piVar12 = iVar1;
          }
          uVar16 = uVar13 & 0xff | uVar16 << 8;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        (**(code **)(*local_200 + 0x38))(local_200,uVar16,1);
      }
      else {
        if (iVar5 != 6) {
          std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_250);
          lVar14 = std::__cxx11::stoll(local_1d8,(size_t *)0x0,10);
          (**(code **)(*plVar10 + 0x38))(plVar10,lVar14,1);
          break;
        }
        std::__cxx11::string::string((string *)&local_250,value,(allocator *)&local_228);
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1d8,(string *)&local_250,_S_out|_S_in);
        local_200 = plVar10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        local_250._M_string_length = 0;
        local_250.field_2._M_allocated_capacity =
             local_250.field_2._M_allocated_capacity & 0xffffffffffffff00;
        iVar5 = 4;
        uVar16 = 0;
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        do {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)local_1d8,(string *)&local_250,':');
          _Var3._M_p = local_250._M_dataplus._M_p;
          piVar12 = __errno_location();
          iVar1 = *piVar12;
          *piVar12 = 0;
          uVar13 = strtol(_Var3._M_p,(char **)&local_228,0x10);
          if (local_228._M_dataplus._M_p == _Var3._M_p) goto LAB_0011c794;
          if ((uVar13 - 0x80000000 < 0xffffffff00000000) || (*piVar12 == 0x22)) goto LAB_0011c7a0;
          if (*piVar12 == 0) {
            *piVar12 = iVar1;
          }
          uVar16 = uVar13 & 0xff | uVar16 << 8;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        (**(code **)(*local_200 + 0x38))(local_200,uVar16,1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
      std::ios_base::~ios_base(local_158);
      return false;
    }
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_250);
    lVar14 = std::__cxx11::stoll(local_1d8,(size_t *)0x0,0x10);
    (**(code **)(*plVar10 + 0x38))(plVar10,lVar14,1);
    break;
  case 3:
    plVar10 = (long *)__dynamic_cast(plVar10,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_250);
    iVar5 = std::__cxx11::string::compare((char *)local_1d8);
    bVar17 = true;
    if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 != 0)) &&
       (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 != 0)) {
      iVar5 = std::__cxx11::string::compare((char *)local_1d8);
      if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 == 0))
         || (iVar5 = std::__cxx11::string::compare((char *)local_1d8), iVar5 == 0)) {
        bVar17 = false;
      }
      else {
        iVar5 = std::__cxx11::stoi(local_1d8,(size_t *)0x0,10);
        bVar17 = iVar5 != 0;
      }
    }
    (**(code **)(*plVar10 + 0x38))(plVar10,bVar17,1);
    break;
  default:
    if ((char)local_22c == '\0') {
      return false;
    }
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_250,"Feature of unknown datatype: ","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar10;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar15) {
      local_1d8[0].field_2._0_8_ = *psVar15;
      local_1d8[0].field_2._8_8_ = plVar10[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar15;
    }
    local_1d8[0]._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar9,(string *)local_1d8);
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 5:
    plVar7 = (long *)__dynamic_cast(plVar10,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_228);
    _Var3._M_p = local_1d8[0]._M_dataplus._M_p;
    plVar10 = (long *)__errno_location();
    lVar11 = *plVar10;
    *(undefined4 *)plVar10 = 0;
    value = (char *)&local_250;
    fVar18 = strtof(_Var3._M_p,(char **)value);
    if (local_250._M_dataplus._M_p != _Var3._M_p) {
      if ((int)*plVar10 == 0) {
        *(int *)plVar10 = (int)lVar11;
      }
      else if ((int)*plVar10 == 0x22) {
        std::__throw_out_of_range("stof");
        goto switchD_0011be48_caseD_9;
      }
      (**(code **)(*plVar7 + 0x38))(SUB84((double)fVar18,0),plVar7,1);
      break;
    }
    goto LAB_0011c7ac;
  case 6:
    plVar10 = (long *)__dynamic_cast(plVar10,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
    GenICam_3_4::gcstring::gcstring((gcstring *)local_1d8,value);
    (**(code **)(*plVar10 + 0x38))(plVar10,local_1d8,1);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_1d8);
    return false;
  case 7:
    plVar10 = (long *)__dynamic_cast(plVar10,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)local_1d8,value,(allocator *)&local_250);
    lVar11 = std::__cxx11::string::find_first_not_of((char *)local_1d8,0x1286f0,0);
    if (lVar11 == -1) {
      local_228._M_dataplus._M_p = (pointer)0x0;
      local_228._M_string_length = 0;
      local_228.field_2._M_allocated_capacity = 0;
      local_200 = plVar10;
      if (local_1d8[0]._M_string_length != 1) {
        uVar16 = 0;
        do {
          std::__cxx11::string::substr((ulong)&local_250,(ulong)local_1d8);
          _Var3._M_p = local_250._M_dataplus._M_p;
          piVar12 = __errno_location();
          iVar5 = *piVar12;
          *piVar12 = 0;
          lVar11 = strtol(_Var3._M_p,(char **)&local_1f8,0x10);
          if (local_1f8 == (long *)_Var3._M_p) {
            std::__throw_invalid_argument("stoi");
LAB_0011c770:
            std::__throw_out_of_range("stoi");
            goto LAB_0011c77c;
          }
          if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (*piVar12 == 0x22)) goto LAB_0011c770;
          if (*piVar12 == 0) {
            *piVar12 = iVar5;
          }
          local_50[0] = (undefined1 *)CONCAT71(local_50[0]._1_7_,(uchar)lVar11);
          if (local_228._M_string_length == local_228.field_2._M_allocated_capacity) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            _M_realloc_insert<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_228,
                       (iterator)local_228._M_string_length,(uchar *)local_50);
          }
          else {
            *(uchar *)local_228._M_string_length = (uchar)lVar11;
            local_228._M_string_length = local_228._M_string_length + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          uVar16 = uVar16 + 2;
        } while (uVar16 < local_1d8[0]._M_string_length - 1);
      }
      plVar10 = local_200;
      sVar4 = local_228._M_string_length;
      _Var3._M_p = local_228._M_dataplus._M_p;
      uVar13 = (**(code **)(*local_200 + 0x48))(local_200,0);
      uVar16 = sVar4 - (long)_Var3._M_p;
      if (uVar13 < uVar16) {
        uVar16 = uVar13;
      }
      (**(code **)(*plVar10 + 0x38))(plVar10,_Var3._M_p,uVar16,1);
      if (local_228._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      break;
    }
    goto LAB_0011c7b8;
  case 9:
switchD_0011be48_caseD_9:
    plVar10 = (long *)__dynamic_cast(plVar10,&GenApi_3_4::INode::typeinfo,
                                     &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
    GenICam_3_4::gcstring::gcstring((gcstring *)local_1d8,value);
    plVar7 = (long *)(**(code **)(*plVar10 + 0x68))(plVar10,local_1d8);
    GenICam_3_4::gcstring::~gcstring((gcstring *)local_1d8);
    if (plVar7 != (long *)0x0) {
      uVar8 = (**(code **)(*plVar7 + 0x38))(plVar7);
      (**(code **)(*plVar10 + 0x50))(plVar10,uVar8,1);
      return false;
    }
    if ((char)local_22c == '\0') {
      return false;
    }
    piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_1f8 = &local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"Enumeration \'","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1f8);
    local_228._M_dataplus._M_p = (pointer)*plVar10;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_228._M_dataplus._M_p == psVar15) {
      local_228.field_2._M_allocated_capacity = *psVar15;
      local_228.field_2._8_8_ = plVar10[3];
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar15;
    }
    local_228._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_228);
    local_250._M_dataplus._M_p = (pointer)*plVar10;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_250._M_dataplus._M_p == psVar15) {
      local_250.field_2._M_allocated_capacity = *psVar15;
      local_250.field_2._8_8_ = plVar10[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar15;
    }
    local_250._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_1d8[0]._M_dataplus._M_p = (pointer)*plVar10;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)local_1d8[0]._M_dataplus._M_p == psVar15) {
      local_1d8[0].field_2._0_8_ = *psVar15;
      local_1d8[0].field_2._8_8_ = plVar10[3];
      local_1d8[0]._M_dataplus._M_p = (pointer)&local_1d8[0].field_2;
    }
    else {
      local_1d8[0].field_2._0_8_ = *psVar15;
    }
    local_1d8[0]._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar9,(string *)local_1d8);
    __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8[0]._M_dataplus._M_p != &local_1d8[0].field_2) {
    operator_delete(local_1d8[0]._M_dataplus._M_p);
  }
  return false;
LAB_0011c77c:
  std::__throw_invalid_argument("stoi");
LAB_0011c788:
  std::__throw_out_of_range("stoi");
LAB_0011c794:
  std::__throw_invalid_argument("stoi");
LAB_0011c7a0:
  std::__throw_out_of_range("stoi");
LAB_0011c7ac:
  std::__throw_invalid_argument("stof");
LAB_0011c7b8:
  piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Register \'","");
  plVar10 = (long *)std::__cxx11::string::append((char *)local_50);
  local_1f8 = (long *)*plVar10;
  plVar7 = plVar10 + 2;
  if (local_1f8 == plVar7) {
    local_1e8 = *plVar7;
    lStack_1e0 = plVar10[3];
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = *plVar7;
  }
  local_1f0 = plVar10[1];
  *plVar10 = (long)plVar7;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_228._M_dataplus._M_p = (pointer)*plVar10;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_228._M_dataplus._M_p == psVar15) {
    local_228.field_2._M_allocated_capacity = *psVar15;
    local_228.field_2._8_8_ = plVar10[3];
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  }
  else {
    local_228.field_2._M_allocated_capacity = *psVar15;
  }
  local_228._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::operator+(&local_250,&local_228,local_1d8);
  std::invalid_argument::invalid_argument(piVar9,(string *)&local_250);
  __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool setString(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
               const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        switch (node->GetPrincipalInterfaceType())
        {
          case GenApi::intfIBoolean:
            {
              GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);

              std::string v=std::string(value);
              if (v == "true" || v == "True" || v == "TRUE")
              {
                p->SetValue(1);
              }
              else if (v == "false" || v == "False" || v == "FALSE")
              {
                p->SetValue(0);
              }
              else
              {
                p->SetValue(static_cast<bool>(std::stoi(v)));
              }
            }
            break;

          case GenApi::intfIInteger:
            {
              GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);

              switch (p->GetRepresentation())
              {
                case GenApi::HexNumber:
                  p->SetValue(std::stoll(std::string(value), 0, 16));
                  break;

                case GenApi::IPV4Address:
                  {
                    int64_t ip=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, '.');
                      ip=(ip<<8)|(stoi(elem)&0xff);
                    }

                    p->SetValue(ip);
                  }
                  break;

                case GenApi::MACAddress:
                  {
                    int64_t mac=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, ':');
                      mac=(mac<<8)|(stoi(elem, 0, 16)&0xff);
                    }

                    p->SetValue(mac);
                  }
                  break;

                default:
                  p->SetValue(std::stoll(std::string(value)));
                  break;
              }
            }
            break;

          case GenApi::intfIFloat:
            {
              GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);
              p->SetValue(std::stof(std::string(value)));
            }
            break;

          case GenApi::intfIEnumeration:
            {
              GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
              GenApi::IEnumEntry *entry=0;

              try
              {
                entry=p->GetEntryByName(value);
              }
              catch (const GENICAM_NAMESPACE::GenericException &)
              { }

              if (entry != 0)
              {
                p->SetIntValue(entry->GetValue());
              }
              else if (exception)
              {
                throw std::invalid_argument(std::string("Enumeration '")+name+
                                            "' does not contain: "+value);
              }
            }
            break;

          case GenApi::intfIRegister:
            {
              GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

              std::string s=value;

              size_t n=s.find_first_not_of("0123456789abcdefABCDEF");
              if (n != std::string::npos)
              {
                throw std::invalid_argument(std::string("Register '")+name+
                  "only accepts hedadecimal values: "+s);
              }

              std::vector<uint8_t> buffer;
              for (size_t i=0; i<s.size()-1; i+=2)
              {
                buffer.push_back(stoi(s.substr(i, 2), 0, 16));
              }

              p->Set(buffer.data(), std::min(buffer.size(), static_cast<size_t>(p->GetLength())));
            }
            break;

          case GenApi::intfIString:
            {
              GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);
              p->SetValue(value);
            }
            break;

          default:
            if (exception)
            {
              throw std::invalid_argument(std::string("Feature of unknown datatype: ")+name);
            }
            break;
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}